

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNB::OPNB(OPNB *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  OPNABase::OPNABase(&this->super_OPNABase);
  (this->super_OPNABase).super_OPNBase.super_Timer._vptr_Timer =
       (_func_int **)&PTR_SetStatus_0021a028;
  lVar2 = 0x14d8;
  do {
    Channel4::Channel4((Channel4 *)
                       ((this->super_OPNABase).super_OPNBase.super_Timer.regta + lVar2 + -10));
    lVar2 = lVar2 + 0x2e0;
  } while (lVar2 != 0x2618);
  this->adpcmabuf = (uint8 *)0x0;
  this->adpcmasize = 0;
  lVar2 = 0;
  do {
    *(undefined2 *)(&this->adpcma[0].pan + lVar2) = 0;
    *(undefined8 *)((long)&this->adpcma[0].adpcmx + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&this->adpcma[0].volume + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&this->adpcma[0].stop + lVar2) = 0;
    lVar2 = lVar2 + 0x24;
  } while (lVar2 != 0xd8);
  this->adpcmatl = '\0';
  this->adpcmakey = '\0';
  this->adpcmatvol = 0;
  (this->super_OPNABase).adpcmmask = 0;
  (this->super_OPNABase).adpcmnotice = 0x8000;
  (this->super_OPNABase).granuality = -1;
  (this->super_OPNABase).super_OPNBase.csmch = (Channel4 *)&this->field_0x1a98;
  InitADPCMATable();
  return;
}

Assistant:

OPNB::OPNB()
{
	adpcmabuf = 0;
	adpcmasize = 0;
	for (int i=0; i<6; i++)
	{
		adpcma[i].pan = 0;
		adpcma[i].level = 0;
		adpcma[i].volume = 0;
		adpcma[i].pos = 0;
		adpcma[i].step = 0;
		adpcma[i].volume = 0;
		adpcma[i].start = 0;
		adpcma[i].stop = 0;
		adpcma[i].adpcmx = 0;
		adpcma[i].adpcmd = 0;
	}
	adpcmatl = 0;
	adpcmakey = 0;
	adpcmatvol = 0;
	adpcmmask = 0;
	adpcmnotice = 0x8000;
	granuality = -1;
	csmch = &ch[2];

	InitADPCMATable();
}